

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::StringMaker<std::vector<bool,_std::allocator<bool>_>_>::convert
                   (String *__return_storage_ptr__,vector<bool,_std::allocator<bool>_> *in)

{
  String *pSVar1;
  _Bit_type *p_Var2;
  uint uVar3;
  const_iterator cVar4;
  ostringstream oss;
  bool local_1e1;
  _Bit_const_iterator local_1e0;
  String *local_1d0;
  anon_union_24_2_13149d16_for_String_2 local_1c8;
  ostringstream local_1a8 [376];
  
  local_1d0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::operator<<((ostream *)local_1a8,"[");
  local_1e0.super__Bit_iterator_base._M_p =
       (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  local_1e0.super__Bit_iterator_base._M_offset = 0;
  p_Var2 = local_1e0.super__Bit_iterator_base._M_p;
  uVar3 = 0;
  while ((p_Var2 != (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p ||
         (uVar3 != (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data
                   ._M_finish.super__Bit_iterator_base._M_offset))) {
    cVar4 = std::_Bit_const_iterator::operator++(&local_1e0,0);
    local_1e1 = (*cVar4.super__Bit_iterator_base._M_p >>
                 (cVar4.super__Bit_iterator_base._8_8_ & 0x3f) & 1) != 0;
    detail::StringMakerBase<true>::convert<bool>((String *)&local_1c8.data,&local_1e1);
    doctest::operator<<((ostream *)local_1a8,(String *)&local_1c8.data);
    String::~String((String *)&local_1c8.data);
    p_Var2 = (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p;
    if ((local_1e0.super__Bit_iterator_base._M_p != p_Var2) ||
       (uVar3 = (in->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
                _M_finish.super__Bit_iterator_base._M_offset,
       local_1e0.super__Bit_iterator_base._M_offset != uVar3)) {
      std::operator<<((ostream *)local_1a8,", ");
      p_Var2 = local_1e0.super__Bit_iterator_base._M_p;
      uVar3 = local_1e0.super__Bit_iterator_base._M_offset;
    }
  }
  std::operator<<((ostream *)local_1a8,"]");
  std::__cxx11::stringbuf::str();
  pSVar1 = local_1d0;
  String::String(local_1d0,local_1c8.data.ptr);
  std::__cxx11::string::~string((string *)&local_1c8.data);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return pSVar1;
}

Assistant:

static String convert(const std::vector<T>& in)
  {
    std::ostringstream oss;

    oss << "[";
    for (auto it = in.begin(); it != in.end();)
    {
      oss << StringMaker<T>::convert(*it++);
      if (it != in.end()) { oss << ", "; }
    }
    oss << "]";

    return oss.str().c_str();
  }